

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h265d_vdpu384a.c
# Opt level: O1

void hal_vdpu384a_record_scaling_list
               (scalingFactor_t *pScalingFactor_out,scalingList_t *pScalingList)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  RK_U8 *pRVar5;
  RK_U8 *pRVar6;
  RK_U8 *pRVar7;
  scalingList_t *psVar8;
  bool bVar9;
  BitputCtx_t bp;
  BitputCtx_t local_50;
  
  mpp_set_bitput_ctx(&local_50,(RK_U64 *)pScalingFactor_out,0xaa);
  pRVar6 = pScalingList->sl[0][0] + 0xc;
  lVar3 = 0;
  do {
    lVar1 = -4;
    do {
      mpp_put_bits(&local_50,(ulong)pRVar6[lVar1 + -8],8);
      mpp_put_bits(&local_50,(ulong)pRVar6[lVar1 + -4],8);
      mpp_put_bits(&local_50,(ulong)pRVar6[lVar1],8);
      mpp_put_bits(&local_50,(ulong)pRVar6[lVar1 + 4],8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
    lVar3 = lVar3 + 1;
    pRVar6 = pRVar6 + 0x40;
  } while (lVar3 != 6);
  pRVar6 = pScalingList->sl[1][0] + 0x18;
  lVar3 = 0;
  do {
    lVar1 = 0;
    pRVar7 = pRVar6;
    do {
      lVar4 = 0;
      pRVar5 = pRVar7;
      do {
        lVar2 = 0;
        do {
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x18],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x10],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -8],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2],8);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        pRVar5 = pRVar5 + 0x20;
        bVar9 = lVar4 == 0;
        lVar4 = lVar4 + 4;
      } while (bVar9);
      pRVar7 = pRVar7 + 4;
      bVar9 = lVar1 == 0;
      lVar1 = lVar1 + 4;
    } while (bVar9);
    lVar3 = lVar3 + 1;
    pRVar6 = pRVar6 + 0x40;
  } while (lVar3 != 6);
  pRVar6 = pScalingList->sl[2][0] + 0x18;
  lVar3 = 0;
  do {
    lVar1 = 0;
    pRVar7 = pRVar6;
    do {
      pRVar5 = pRVar7;
      lVar4 = 0;
      do {
        lVar2 = 0;
        do {
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x18],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x10],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -8],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2],8);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        pRVar5 = pRVar5 + 0x20;
        bVar9 = lVar4 == 0;
        lVar4 = lVar4 + 4;
      } while (bVar9);
      pRVar7 = pRVar7 + 4;
      bVar9 = lVar1 == 0;
      lVar1 = lVar1 + 4;
    } while (bVar9);
    lVar3 = lVar3 + 1;
    pRVar6 = pRVar6 + 0x40;
  } while (lVar3 != 6);
  pRVar6 = pScalingList->sl[3][0] + 0x18;
  lVar3 = 0;
  do {
    lVar1 = 0;
    pRVar7 = pRVar6;
    do {
      pRVar5 = pRVar7;
      lVar4 = 0;
      do {
        lVar2 = 0;
        do {
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x18],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -0x10],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2 + -8],8);
          mpp_put_bits(&local_50,(ulong)pRVar5[lVar2],8);
          lVar2 = lVar2 + 1;
        } while (lVar2 != 4);
        pRVar5 = pRVar5 + 0x20;
        bVar9 = lVar4 == 0;
        lVar4 = lVar4 + 4;
      } while (bVar9);
      pRVar7 = pRVar7 + 4;
      bVar9 = lVar1 == 0;
      lVar1 = lVar1 + 4;
    } while (bVar9);
    lVar3 = lVar3 + 1;
    pRVar6 = pRVar6 + 0x40;
  } while (lVar3 != 6);
  lVar3 = 0;
  psVar8 = pScalingList;
  do {
    lVar1 = 0;
    do {
      mpp_put_bits(&local_50,(ulong)psVar8->sl[0][0][lVar1],8);
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x10);
    lVar3 = lVar3 + 1;
    psVar8 = (scalingList_t *)(psVar8->sl[0] + 1);
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_50,(ulong)pScalingList->sl_dc[0][lVar3],8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  lVar3 = 0;
  do {
    mpp_put_bits(&local_50,(ulong)pScalingList->sl_dc[1][lVar3],8);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 6);
  mpp_put_align(&local_50,0x80,0);
  return;
}

Assistant:

void hal_vdpu384a_record_scaling_list(scalingFactor_t *pScalingFactor_out, scalingList_t *pScalingList)
{
    RK_S32 i;
    RK_U32 listId;
    BitputCtx_t bp;

    mpp_set_bitput_ctx(&bp, (RK_U64 *)pScalingFactor_out, 170); // 170*64bits

    //-------- following make it by hardware needed --------
    //sizeId == 0, block4x4
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];
        /* dump by block4x4, vectial direction */
        for (i = 0; i < 4; i++) {
            mpp_put_bits(&bp, p_data[i + 0], 8);
            mpp_put_bits(&bp, p_data[i + 4], 8);
            mpp_put_bits(&bp, p_data[i + 8], 8);
            mpp_put_bits(&bp, p_data[i + 12], 8);
        }
    }
    //sizeId == 1, block8x8
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[1][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 2, block16x16
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[2][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 3, blcok32x32
    for (listId = 0; listId < 6; listId++) {
        RK_S32 blk4_x = 0, blk4_y = 0;
        RK_U8 *p_data = pScalingList->sl[3][listId];

        /* dump by block4x4, vectial direction */
        for (blk4_x = 0; blk4_x < 8; blk4_x += 4) {
            for (blk4_y = 0; blk4_y < 8; blk4_y += 4) {
                RK_S32 pos = blk4_y * 8 + blk4_x;

                for (i = 0; i < 4; i++) {
                    mpp_put_bits(&bp, p_data[pos + i + 0], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 8], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 16], 8);
                    mpp_put_bits(&bp, p_data[pos + i + 24], 8);
                }
            }
        }
    }
    //sizeId == 0, block4x4, horiztion direction */
    for (listId = 0; listId < SCALING_LIST_NUM; listId++) {
        RK_U8 *p_data = pScalingList->sl[0][listId];

        for (i = 0; i < 16; i++)
            mpp_put_bits(&bp, p_data[i], 8);
    }

    // dump dc value
    for (i = 0; i < SCALING_LIST_NUM; i++)//sizeId = 2, 16x16
        mpp_put_bits(&bp, pScalingList->sl_dc[0][i], 8);
    for (i = 0; i < SCALING_LIST_NUM; i++) //sizeId = 3, 32x32
        mpp_put_bits(&bp, pScalingList->sl_dc[1][i], 8);

    mpp_put_align(&bp, 128, 0);
}